

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetCodeGenerator.cc
# Opt level: O3

void __thiscall
flow::TargetCodeGenerator::changeStack(TargetCodeGenerator *this,size_t pops,Value *pushValue)

{
  iterator *piVar1;
  _Elt_pointer ppVVar2;
  Value *local_18;
  
  if (pops != 0) {
    pop(this,pops);
  }
  if (pushValue != (Value *)0x0) {
    ppVVar2 = (this->stack_).
              super__Deque_base<const_flow::Value_*,_std::allocator<const_flow::Value_*>_>._M_impl.
              super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar2 ==
        (this->stack_).super__Deque_base<const_flow::Value_*,_std::allocator<const_flow::Value_*>_>.
        _M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
      local_18 = pushValue;
      std::deque<flow::Value_const*,std::allocator<flow::Value_const*>>::
      _M_push_back_aux<flow::Value_const*const&>
                ((deque<flow::Value_const*,std::allocator<flow::Value_const*>> *)&this->stack_,
                 &local_18);
    }
    else {
      *ppVVar2 = pushValue;
      piVar1 = &(this->stack_).
                super__Deque_base<const_flow::Value_*,_std::allocator<const_flow::Value_*>_>._M_impl
                .super__Deque_impl_data._M_finish;
      piVar1->_M_cur = piVar1->_M_cur + 1;
    }
  }
  return;
}

Assistant:

void TargetCodeGenerator::changeStack(size_t pops, const Value* pushValue) {
  if (pops)
    pop(pops);

  if (pushValue)
    push(pushValue);
}